

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_glossary_gnu_ds(arg_dstr_t ds,void **argtable)

{
  char cVar1;
  char *__s;
  ushort *puVar2;
  char *__s_00;
  uint uVar3;
  size_t sVar4;
  ushort **ppuVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  ulong uVar14;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  uint local_f8 [50];
  
  pbVar12 = (byte *)*argtable;
  if ((*pbVar12 & 1) == 0) {
    lVar7 = 0;
    do {
      if (*(long *)(pbVar12 + 0x20) != 0) {
        memset(local_f8,0,200);
        if (*(char **)(pbVar12 + 0x10) != (char *)0x0 && *(size_t *)(pbVar12 + 8) == 0) {
          local_f8[0] = 0x20202020;
        }
        __s = *(char **)(pbVar12 + 0x20);
        arg_cat_optionv((char *)local_f8,*(size_t *)(pbVar12 + 8),*(char **)(pbVar12 + 0x10),
                        *(char **)(pbVar12 + 0x18),(char *)(ulong)(*pbVar12 & 4),0x1127b6,
                        (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        sVar4 = strlen((char *)local_f8);
        if (0x19 < sVar4) {
          arg_dstr_catf(ds,"  %-25s %s\n",local_f8,"");
          local_f8[0] = local_f8[0] & 0xffffff00;
        }
        arg_dstr_catf(ds,"  %-25s ",local_f8);
        sVar4 = strlen(__s);
        if (0xfffffffe < sVar4) {
          __assert_fail("strlen(text) < UINT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                        ,0x16c5,
                        "void arg_print_formatted_ds(arg_dstr_t, const unsigned int, const unsigned int, const char *)"
                       );
        }
        if ((uint)sVar4 != 0) {
          uVar14 = 0;
          ppuVar5 = __ctype_b_loc();
          uVar11 = sVar4 & 0xffffffff;
          do {
            puVar2 = *ppuVar5;
            uVar8 = (uint)uVar14;
            uVar14 = (ulong)(uVar8 - 1);
            do {
              uVar8 = uVar8 + 1;
              iVar10 = (int)uVar14;
              uVar13 = iVar10 + 1;
              uVar14 = (ulong)uVar13;
              cVar1 = __s[uVar14];
              if ((long)cVar1 == 10) break;
            } while ((puVar2[cVar1] & 0x2000) != 0);
            if (0x34 < (int)uVar11 - uVar13) {
              uVar9 = iVar10 + 0x35;
              uVar3 = uVar9;
              if (uVar13 < 0xffffffcc) {
                uVar9 = iVar10 + 0x35;
                uVar11 = (ulong)uVar9;
                do {
                  if ((*(byte *)((long)puVar2 + (long)__s[uVar9] * 2 + 1) & 0x20) != 0) break;
                  uVar9 = uVar9 - 1;
                } while (uVar13 < uVar9);
                uVar3 = uVar9;
                if (uVar9 == uVar13) goto LAB_0010ecfd;
              }
              while (((uVar13 < uVar3 && (uVar9 = uVar3, cVar1 != '\n')) &&
                     ((puVar2[__s[uVar3]] & 0x2000) != 0))) {
                uVar9 = uVar13;
                uVar3 = uVar3 - 1;
              }
              uVar11 = (ulong)(uVar9 + 1);
            }
LAB_0010ecfd:
            uVar9 = (uint)uVar11;
            if (uVar13 < uVar9) {
              do {
                uVar13 = uVar8;
                cVar1 = __s[uVar14];
                if (cVar1 == '\n') break;
                setup_append_buf(ds,2);
                __s_00 = ds->data;
                sVar6 = strlen(__s_00);
                __s_00[sVar6] = cVar1;
                uVar14 = uVar14 + 1;
                uVar8 = uVar13 + 1;
              } while (uVar14 < uVar11);
              uVar14 = (ulong)uVar13;
              in_stack_fffffffffffffedc = uVar9;
            }
            arg_dstr_cat(ds,"\n");
            uVar11 = (ulong)uVar9;
            if (uVar9 < (uint)sVar4) {
              iVar10 = 0x1c;
              do {
                arg_dstr_cat(ds," ");
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
              uVar11 = sVar4 & 0xffffffff;
            }
          } while ((uint)uVar14 < (uint)uVar11);
        }
      }
      pbVar12 = (byte *)argtable[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while ((*pbVar12 & 1) == 0);
  }
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

void arg_print_glossary_gnu_ds(arg_dstr_t ds, void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;

            if (!shortopts && longopts) {
                /* Indent trailing line by 4 spaces... */
                memset(syntax, ' ', 4);
                *(syntax + 4) = '\0';
            }

            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");

            /* If syntax fits not into column, print glossary in new line... */
            if (strlen(syntax) > 25) {
                arg_dstr_catf(ds, "  %-25s %s\n", syntax, "");
                *syntax = '\0';
            }

            arg_dstr_catf(ds, "  %-25s ", syntax);
            arg_print_formatted_ds(ds, 28, 79, glossary);
        }
    } /* for each table entry */

    arg_dstr_cat(ds, "\n");
}